

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O2

void __thiscall
draco::SequentialIntegerAttributeDecoder::StoreTypedValues<short>
          (SequentialIntegerAttributeDecoder *this,uint32_t num_values)

{
  byte bVar1;
  PointAttribute *pPVar2;
  tuple<short_*,_std::default_delete<short[]>_> __src;
  long lVar3;
  long lVar4;
  ulong __n;
  uint32_t i;
  uint32_t uVar5;
  ulong uVar6;
  unique_ptr<short[],_std::default_delete<short[]>_> att_val;
  long local_58;
  __uniq_ptr_impl<short,_std::default_delete<short[]>_> local_38;
  
  bVar1 = (((this->super_SequentialAttributeDecoder).attribute_)->super_GeometryAttribute).
          num_components_;
  __n = (ulong)((uint)bVar1 * 2);
  __src.super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
  super__Head_base<0UL,_short_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>)operator_new__(__n);
  pPVar2 = (this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  uVar5 = 0;
  if (pPVar2->num_unique_entries_ == 0) {
    local_58 = 0;
  }
  else {
    local_58 = *(long *)(pPVar2->super_GeometryAttribute).buffer_ +
               (pPVar2->super_GeometryAttribute).byte_offset_;
  }
  lVar4 = 0;
  lVar3 = 0;
  local_38._M_t.super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
  super__Head_base<0UL,_short_*,_false>._M_head_impl =
       (tuple<short_*,_std::default_delete<short[]>_>)
       (tuple<short_*,_std::default_delete<short[]>_>)
       __src.super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
       super__Head_base<0UL,_short_*,_false>._M_head_impl;
  for (; uVar5 != num_values; uVar5 = uVar5 + 1) {
    for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined2 *)
       ((long)__src.super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
              super__Head_base<0UL,_short_*,_false>._M_head_impl + uVar6 * 2) =
           *(undefined2 *)(local_58 + (long)(int)lVar3 * 4 + uVar6 * 4);
    }
    memcpy((void *)(*(long *)&(((((this->super_SequentialAttributeDecoder).attribute_)->
                                attribute_buffer_)._M_t.
                                super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl)->
                              data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> +
                   lVar4),
           (void *)__src.super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                   super__Head_base<0UL,_short_*,_false>._M_head_impl,__n);
    lVar4 = lVar4 + __n;
    lVar3 = (long)(int)lVar3 + uVar6;
  }
  std::unique_ptr<short[],_std::default_delete<short[]>_>::~unique_ptr
            ((unique_ptr<short[],_std::default_delete<short[]>_> *)&local_38);
  return;
}

Assistant:

void SequentialIntegerAttributeDecoder::StoreTypedValues(uint32_t num_values) {
  const int num_components = attribute()->num_components();
  const int entry_size = sizeof(AttributeTypeT) * num_components;
  const std::unique_ptr<AttributeTypeT[]> att_val(
      new AttributeTypeT[num_components]);
  const int32_t *const portable_attribute_data = GetPortableAttributeData();
  int val_id = 0;
  int out_byte_pos = 0;
  for (uint32_t i = 0; i < num_values; ++i) {
    for (int c = 0; c < num_components; ++c) {
      const AttributeTypeT value =
          static_cast<AttributeTypeT>(portable_attribute_data[val_id++]);
      att_val[c] = value;
    }
    // Store the integer value into the attribute buffer.
    attribute()->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
    out_byte_pos += entry_size;
  }
}